

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncTaskManager.hpp
# Opt level: O3

void __thiscall sftm::CAsyncTaskManager::Start(CAsyncTaskManager *this,uint32_t nInitWorkers)

{
  uint uVar1;
  ulong uVar2;
  CAsyncWorker *this_00;
  
  uVar1 = 0x3f;
  if (nInitWorkers < 0x41) {
    uVar1 = nInitWorkers;
  }
  this->m_nWorkerCount = uVar1;
  if (uVar1 != 0) {
    this_00 = (this->m_workers)._M_elems;
    uVar2 = (ulong)uVar1;
    do {
      (this_00->m_ownerData).m_pCvWorkerIdle = &this->m_cvWorkerIdle;
      (this_00->m_ownerData).m_pMutWorkerIdle = &this->m_mtxWorkerIdle;
      (this_00->m_ownerData).m_pTaskQueue = &this->m_taskQueue;
      CAsyncWorker::Start(this_00);
      this_00 = this_00 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void Start(std::uint32_t nInitWorkers = 1) noexcept
		{
			if (nInitWorkers > MAX_WORKERS)
				nInitWorkers = MAX_WORKERS - 1;
			m_nWorkerCount = nInitWorkers;

			for (std::uint32_t nWorker = 0; nWorker < nInitWorkers; nWorker++)
			{
				m_workers[nWorker].m_ownerData.m_pCvWorkerIdle	= &m_cvWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pMutWorkerIdle = &m_mtxWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pTaskQueue		= &m_taskQueue;

				m_workers[nWorker].Start();
			}
		}